

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O2

void helper_dctdp(CPUPPCState_conflict *env,ppc_fprp_t *t,ppc_fprp_t *b)

{
  uint32_t b_short;
  PPC_DFP dfp;
  decimal32 local_fc;
  undefined1 local_f8 [216];
  
  local_fc.bytes = *(uint8_t (*) [4])(b->u32 + 2);
  dfp_prepare_decimal64((PPC_DFP *)local_f8,(ppc_fprp_t *)0x0,(ppc_fprp_t *)0x0,env);
  decimal32ToNumber(&local_fc,(decNumber_conflict1 *)(local_f8 + 0x40));
  dfp_finalize_decimal64((PPC_DFP *)local_f8);
  t->u64[1] = local_f8._16_8_;
  dfp_set_FPRF_from_FRT((PPC_DFP *)local_f8);
  return;
}

Assistant:

void helper_dctdp(CPUPPCState *env, ppc_fprp_t *t, ppc_fprp_t *b)
{
    struct PPC_DFP dfp;
    ppc_vsr_t vb;
    uint32_t b_short;

    get_dfp64(&vb, b);
    b_short = (uint32_t)vb.VsrD(1);

    dfp_prepare_decimal64(&dfp, 0, 0, env);
    decimal32ToNumber((decimal32 *)&b_short, &dfp.t);
    dfp_finalize_decimal64(&dfp);
    set_dfp64(t, &dfp.vt);
    dfp_set_FPRF_from_FRT(&dfp);
}